

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O0

BasicStringView<const_char> __thiscall
Corrade::Containers::BasicStringView<const_char>::findOr
          (BasicStringView<const_char> *this,StringView substring,char *fail)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *found;
  size_t substringSize;
  char *fail_local;
  BasicStringView<const_char> *this_local;
  StringView substring_local;
  
  substring_local._data = (char *)substring._sizePlusFlags;
  this_local = (BasicStringView<const_char> *)substring._data;
  sVar1 = size((BasicStringView<const_char> *)&this_local);
  pcVar3 = this->_data;
  sVar2 = size(this);
  pcVar3 = (char *)Corrade::Containers::Implementation::stringFindString
                             (pcVar3,sVar2,(char *)this_local,sVar1);
  if (pcVar3 == (char *)0x0) {
    BasicStringView((BasicStringView<const_char> *)&substring_local._sizePlusFlags,fail,0,
                    (nullptr_t)0x0);
  }
  else {
    join_0x00000010_0x00000000_ = slice(this,pcVar3,pcVar3 + sVar1);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

inline BasicStringView<T> BasicStringView<T>::findOr(const StringView substring, T* const fail) const {
    /* Cache the getters to speed up debug builds */
    const std::size_t substringSize = substring.size();
    if(const char* const found = Implementation::stringFindString(_data, size(), substring._data, substringSize))
        return slice(const_cast<T*>(found), const_cast<T*>(found + substringSize));

    /* Using an internal assert-less constructor, the public constructor
       asserts would be redundant. Since it's a zero-sized view, it doesn't
       really make sense to try to preserve any flags. */
    return BasicStringView<T>{fail, 0 /* empty, no flags */, nullptr};
}